

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::CreateCDCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *tgtDir,string *relDir)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  pointer pbVar1;
  __type _Var2;
  bool bVar3;
  cmAlphaNum *this_00;
  char *__lhs;
  cmOutputConverter *this_01;
  pointer __rhs;
  string prefix;
  string outputForExisting;
  undefined1 auStack_f8 [40];
  cmAlphaNum local_d0;
  string local_a0;
  string local_80;
  cmAlphaNum local_60;
  
  this_00 = (cmAlphaNum *)auStack_f8;
  _Var2 = std::operator==(tgtDir,relDir);
  if (!_Var2) {
    bVar3 = cmLocalGenerator::IsMinGWMake((cmLocalGenerator *)this);
    __lhs = "cd ";
    if (bVar3) {
      __lhs = "cd /d ";
    }
    if (*(char *)((long)&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator
                         [1].FindMakeProgramFile._M_string_length + 2) == '\0') {
      auStack_f8._32_8_ = (ulong)bVar3 * 3 + 3;
      this_01 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter
      ;
      local_d0.View_._M_len = auStack_f8._32_8_;
      local_d0.View_._M_str = __lhs;
      cmOutputConverter::ConvertToOutputForExisting(&local_80,this_01,tgtDir,SHELL);
      local_60.View_._M_len = local_80._M_string_length;
      local_60.View_._M_str = local_80._M_dataplus._M_p;
      cmStrCat<>((string *)auStack_f8,(cmAlphaNum *)(auStack_f8 + 0x28),&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(commands,(commands->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,(value_type *)auStack_f8);
      local_d0.View_._M_len = auStack_f8._32_8_;
      local_d0.View_._M_str = __lhs;
      cmOutputConverter::ConvertToOutputForExisting(&local_a0,this_01,relDir,SHELL);
      local_60.View_._M_len = local_a0._M_string_length;
      local_60.View_._M_str = local_a0._M_dataplus._M_p;
      cmStrCat<>(&local_80,(cmAlphaNum *)(auStack_f8 + 0x28),&local_60);
      std::__cxx11::string::operator=((string *)auStack_f8,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_f8);
    }
    else {
      cmOutputConverter::ConvertToOutputForExisting
                ((string *)&local_60,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,tgtDir,SHELL);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (auStack_f8 + 0x28),__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_f8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (auStack_f8 + 0x28)," && ");
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(auStack_f8 + 0x28);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      pbVar1 = (commands->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (__rhs = (commands->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar1; __rhs = __rhs + 1) {
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_f8,__rhs);
        std::__cxx11::string::operator=((string *)__rhs,(string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      std::__cxx11::string::~string((string *)auStack_f8);
      this_00 = &local_60;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::CreateCDCommand(
  std::vector<std::string>& commands, std::string const& tgtDir,
  std::string const& relDir)
{
  // do we need to cd?
  if (tgtDir == relDir) {
    return;
  }

  // In a Windows shell we must change drive letter too.  The shell
  // used by NMake and Borland make does not support "cd /d" so this
  // feature simply cannot work with them (Borland make does not even
  // support changing the drive letter with just "d:").
  const char* cd_cmd = this->IsMinGWMake() ? "cd /d " : "cd ";

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  if (!gg->UnixCD) {
    // On Windows we must perform each step separately and then change
    // back because the shell keeps the working directory between
    // commands.
    std::string cmd =
      cmStrCat(cd_cmd, this->ConvertToOutputForExisting(tgtDir));
    commands.insert(commands.begin(), cmd);

    // Change back to the starting directory.
    cmd = cmStrCat(cd_cmd, this->ConvertToOutputForExisting(relDir));
    commands.push_back(std::move(cmd));
  } else {
    // On UNIX we must construct a single shell command to change
    // directory and build because make resets the directory between
    // each command.
    std::string outputForExisting = this->ConvertToOutputForExisting(tgtDir);
    std::string prefix = cd_cmd + outputForExisting + " && ";
    std::transform(commands.begin(), commands.end(), commands.begin(),
                   [&prefix](std::string const& s) { return prefix + s; });
  }
}